

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_haxe_generator.cc
# Opt level: O0

void __thiscall
t_haxe_generator::generate_service_client(t_haxe_generator *this,t_service *tservice)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  t_service *ptVar4;
  undefined4 extraout_var;
  ostream *poVar5;
  ulong uVar6;
  vector<t_function_*,_std::allocator<t_function_*>_> *__x;
  reference pptVar7;
  string *psVar8;
  char *pcVar9;
  t_type *ptVar10;
  t_struct *this_00;
  reference pptVar11;
  string local_6d8;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_6b8
  ;
  t_field **local_6b0;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_6a8
  ;
  const_iterator x_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *xceptions;
  t_struct *xs;
  string local_688;
  string local_668;
  allocator local_641;
  string local_640;
  undefined1 local_620 [8];
  string result;
  string local_5f8;
  undefined1 local_5d8 [8];
  string msg;
  undefined1 local_598 [8];
  string resultname;
  string local_570;
  undefined1 local_550 [8];
  string appex;
  string local_510;
  string local_4f0;
  allocator local_4c9;
  string local_4c8;
  undefined1 local_4a8 [8];
  string retval;
  string local_468;
  string local_448;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_428
  ;
  t_field **local_420;
  string local_418;
  string local_3f8;
  allocator local_3d1;
  string local_3d0 [8];
  string calltype;
  string local_3a8;
  undefined1 local_388 [8];
  string args;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  const_iterator fld_iter;
  undefined1 local_338 [8];
  string argsname;
  t_struct *arg_struct;
  string funname;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_2e8;
  t_function **local_2e0;
  __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_2d8;
  const_iterator f_iter;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  string local_98;
  allocator local_71;
  string local_70 [8];
  string extends_client;
  allocator local_39;
  undefined1 local_38 [8];
  string extends;
  t_service *tservice_local;
  t_haxe_generator *this_local;
  
  extends.field_2._8_8_ = tservice;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_38,"",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"",&local_71);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  ptVar4 = t_service::get_extends((t_service *)extends.field_2._8_8_);
  if (ptVar4 != (t_service *)0x0) {
    ptVar4 = t_service::get_extends((t_service *)extends.field_2._8_8_);
    iVar2 = (*(ptVar4->super_t_type).super_t_doc._vptr_t_doc[3])();
    std::__cxx11::string::string((string *)&local_b8,(string *)CONCAT44(extraout_var,iVar2));
    get_cap_name(&local_98,this,&local_b8);
    std::__cxx11::string::operator=((string *)local_38,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::operator+(&local_f8," extends ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
    std::operator+(&local_d8,&local_f8,"Impl");
    std::__cxx11::string::operator=(local_70,(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
  }
  generate_rtti_decoration(this,(ostream *)&this->f_service_);
  poVar5 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar5 = std::operator<<(poVar5,"class ");
  std::__cxx11::string::string
            ((string *)&local_138,
             (string *)&(this->super_t_oop_generator).super_t_generator.service_name_);
  get_cap_name(&local_118,this,&local_138);
  poVar5 = std::operator<<(poVar5,(string *)&local_118);
  poVar5 = std::operator<<(poVar5,"Impl");
  poVar5 = std::operator<<(poVar5,local_70);
  poVar5 = std::operator<<(poVar5," implements ");
  std::__cxx11::string::string
            ((string *)&local_178,
             (string *)&(this->super_t_oop_generator).super_t_generator.service_name_);
  get_cap_name(&local_158,this,&local_178);
  poVar5 = std::operator<<(poVar5,(string *)&local_158);
  poVar5 = std::operator<<(poVar5," {");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  t_generator::indent_up((t_generator *)this);
  poVar5 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar5 = std::operator<<(poVar5,
                           "public function new( iprot : TProtocol, oprot : TProtocol = null)");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)&this->f_service_);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    t_generator::indent_abi_cxx11_(&local_258,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)&this->f_service_,(string *)&local_258);
    poVar5 = std::operator<<(poVar5,"super(iprot, oprot);");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_258);
  }
  else {
    t_generator::indent_abi_cxx11_(&local_198,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)&this->f_service_,(string *)&local_198);
    poVar5 = std::operator<<(poVar5,"iprot_ = iprot;");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_198);
    t_generator::indent_abi_cxx11_(&local_1b8,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)&this->f_service_,(string *)&local_1b8);
    poVar5 = std::operator<<(poVar5,"if (oprot == null) {");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1b8);
    t_generator::indent_up((t_generator *)this);
    t_generator::indent_abi_cxx11_(&local_1d8,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)&this->f_service_,(string *)&local_1d8);
    poVar5 = std::operator<<(poVar5,"oprot_ = iprot;");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1d8);
    t_generator::indent_down((t_generator *)this);
    t_generator::indent_abi_cxx11_(&local_1f8,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)&this->f_service_,(string *)&local_1f8);
    poVar5 = std::operator<<(poVar5,"} else {");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1f8);
    t_generator::indent_up((t_generator *)this);
    t_generator::indent_abi_cxx11_(&local_218,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)&this->f_service_,(string *)&local_218);
    poVar5 = std::operator<<(poVar5,"oprot_ = oprot;");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_218);
    t_generator::indent_down((t_generator *)this);
    t_generator::indent_abi_cxx11_(&local_238,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)&this->f_service_,(string *)&local_238);
    poVar5 = std::operator<<(poVar5,"}");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_238);
  }
  t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)&this->f_service_);
  std::operator<<((ostream *)&this->f_service_,(string *)&::endl_abi_cxx11_);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) != 0) {
    t_generator::indent_abi_cxx11_(&local_278,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)&this->f_service_,(string *)&local_278);
    poVar5 = std::operator<<(poVar5,"private var iprot_ : TProtocol;");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_298,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&local_298);
    poVar5 = std::operator<<(poVar5,"private var oprot_ : TProtocol;");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_
              ((string *)
               &functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)
                                    &functions.
                                     super__Vector_base<t_function_*,_std::allocator<t_function_*>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    poVar5 = std::operator<<(poVar5,"private var seqid_ : Int;");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string
              ((string *)
               &functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)&local_278);
    poVar5 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
    poVar5 = std::operator<<(poVar5,"public function getInputProtocol() : TProtocol");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)&this->f_service_);
    poVar5 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
    poVar5 = std::operator<<(poVar5,"return this.iprot_;");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)&this->f_service_);
    std::operator<<((ostream *)&this->f_service_,(string *)&::endl_abi_cxx11_);
    poVar5 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
    poVar5 = std::operator<<(poVar5,"public function getOutputProtocol() : TProtocol");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)&this->f_service_);
    poVar5 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
    poVar5 = std::operator<<(poVar5,"return this.oprot_;");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)&this->f_service_);
    std::operator<<((ostream *)&this->f_service_,(string *)&::endl_abi_cxx11_);
  }
  __x = t_service::get_functions((t_service *)extends.field_2._8_8_);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter,__x);
  __gnu_cxx::
  __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  ::__normal_iterator(&local_2d8);
  local_2e8._M_current =
       (t_function **)
       std::vector<t_function_*,_std::allocator<t_function_*>_>::begin
                 ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  __gnu_cxx::
  __normal_iterator<t_function*const*,std::vector<t_function*,std::allocator<t_function*>>>::
  __normal_iterator<t_function**>
            ((__normal_iterator<t_function*const*,std::vector<t_function*,std::allocator<t_function*>>>
              *)&local_2e0,&local_2e8);
  local_2d8._M_current = local_2e0;
  while( true ) {
    funname.field_2._8_8_ =
         std::vector<t_function_*,_std::allocator<t_function_*>_>::end
                   ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
    bVar1 = __gnu_cxx::operator!=
                      (&local_2d8,
                       (__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                        *)((long)&funname.field_2 + 8));
    if (!bVar1) break;
    pptVar7 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_2d8);
    psVar8 = t_function::get_name_abi_cxx11_(*pptVar7);
    std::__cxx11::string::string((string *)&arg_struct,(string *)psVar8);
    pptVar7 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_2d8);
    generate_service_method_signature(this,*pptVar7,false,true);
    t_generator::indent_up((t_generator *)this);
    pptVar7 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_2d8);
    argsname.field_2._8_8_ = t_function::get_arglist(*pptVar7);
    pptVar7 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_2d8);
    psVar8 = t_function::get_name_abi_cxx11_(*pptVar7);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fld_iter,
                   psVar8,"_args");
    get_cap_name((string *)local_338,this,(string *)&fld_iter);
    std::__cxx11::string::~string((string *)&fld_iter);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    __normal_iterator((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                       *)&fields);
    args.field_2._8_8_ = (size_type)t_struct::get_members(argsname.field_2._8_8_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_3a8,"args",(allocator *)(calltype.field_2._M_local_buf + 0xf));
    t_generator::tmp((string *)local_388,(t_generator *)this,&local_3a8);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::allocator<char>::~allocator((allocator<char> *)(calltype.field_2._M_local_buf + 0xf));
    pptVar7 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_2d8);
    bVar1 = t_function::is_oneway(*pptVar7);
    pcVar9 = "CALL";
    if (bVar1) {
      pcVar9 = "ONEWAY";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3d0,pcVar9,&local_3d1);
    std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
    t_generator::indent_abi_cxx11_(&local_3f8,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)&this->f_service_,(string *)&local_3f8);
    poVar5 = std::operator<<(poVar5,"oprot_.writeMessageBegin(new TMessage(\"");
    poVar5 = std::operator<<(poVar5,(string *)&arg_struct);
    poVar5 = std::operator<<(poVar5,"\", TMessageType.");
    poVar5 = std::operator<<(poVar5,local_3d0);
    poVar5 = std::operator<<(poVar5,", seqid_));");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_418,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&local_418);
    poVar5 = std::operator<<(poVar5,"var ");
    poVar5 = std::operator<<(poVar5,(string *)local_388);
    poVar5 = std::operator<<(poVar5," : ");
    poVar5 = std::operator<<(poVar5,(string *)local_338);
    poVar5 = std::operator<<(poVar5," = new ");
    poVar5 = std::operator<<(poVar5,(string *)local_338);
    poVar5 = std::operator<<(poVar5,"();");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_418);
    std::__cxx11::string::~string((string *)&local_3f8);
    local_420 = (t_field **)
                std::vector<t_field_*,_std::allocator<t_field_*>_>::begin
                          ((vector<t_field_*,_std::allocator<t_field_*>_> *)args.field_2._8_8_);
    fields = (vector<t_field_*,_std::allocator<t_field_*>_> *)local_420;
    while( true ) {
      local_428._M_current =
           (t_field **)
           std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                     ((vector<t_field_*,_std::allocator<t_field_*>_> *)args.field_2._8_8_);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                          *)&fields,&local_428);
      if (!bVar1) break;
      t_generator::indent_abi_cxx11_(&local_448,(t_generator *)this);
      poVar5 = std::operator<<((ostream *)&this->f_service_,(string *)&local_448);
      poVar5 = std::operator<<(poVar5,(string *)local_388);
      poVar5 = std::operator<<(poVar5,".");
      pptVar11 = __gnu_cxx::
                 __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                 ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                              *)&fields);
      psVar8 = t_field::get_name_abi_cxx11_(*pptVar11);
      poVar5 = std::operator<<(poVar5,(string *)psVar8);
      poVar5 = std::operator<<(poVar5," = ");
      pptVar11 = __gnu_cxx::
                 __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                 ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                              *)&fields);
      psVar8 = t_field::get_name_abi_cxx11_(*pptVar11);
      poVar5 = std::operator<<(poVar5,(string *)psVar8);
      poVar5 = std::operator<<(poVar5,";");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_448);
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  *)&fields);
    }
    t_generator::indent_abi_cxx11_(&local_468,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)&this->f_service_,(string *)&local_468);
    poVar5 = std::operator<<(poVar5,(string *)local_388);
    poVar5 = std::operator<<(poVar5,".write(oprot_);");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_((string *)((long)&retval.field_2 + 8),(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)(retval.field_2._M_local_buf + 8));
    poVar5 = std::operator<<(poVar5,"oprot_.writeMessageEnd();");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)(retval.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_468);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_4c8,"retval",&local_4c9);
    t_generator::tmp((string *)local_4a8,(t_generator *)this,&local_4c8);
    std::__cxx11::string::~string((string *)&local_4c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
    pptVar7 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_2d8);
    bVar1 = t_function::is_oneway(*pptVar7);
    if (!bVar1) {
      pptVar7 = __gnu_cxx::
                __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                ::operator*(&local_2d8);
      ptVar10 = t_function::get_returntype(*pptVar7);
      uVar3 = (*(ptVar10->super_t_doc)._vptr_t_doc[4])();
      if ((uVar3 & 1) == 0) {
        t_generator::indent_abi_cxx11_(&local_4f0,(t_generator *)this);
        poVar5 = std::operator<<((ostream *)&this->f_service_,(string *)&local_4f0);
        poVar5 = std::operator<<(poVar5,"var ");
        poVar5 = std::operator<<(poVar5,(string *)local_4a8);
        poVar5 = std::operator<<(poVar5," : ");
        pptVar7 = __gnu_cxx::
                  __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                  ::operator*(&local_2d8);
        ptVar10 = t_function::get_returntype(*pptVar7);
        type_name_abi_cxx11_(&local_510,this,ptVar10,false,false);
        poVar5 = std::operator<<(poVar5,(string *)&local_510);
        poVar5 = std::operator<<(poVar5,";");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_510);
        std::__cxx11::string::~string((string *)&local_4f0);
      }
    }
    pptVar7 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_2d8);
    bVar1 = t_function::is_oneway(*pptVar7);
    if (bVar1) {
      t_generator::indent_abi_cxx11_((string *)((long)&appex.field_2 + 8),(t_generator *)this);
      poVar5 = std::operator<<((ostream *)&this->f_service_,
                               (string *)(appex.field_2._M_local_buf + 8));
      poVar5 = std::operator<<(poVar5,"oprot_.getTransport().flush();");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)(appex.field_2._M_local_buf + 8));
    }
    else {
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
      poVar5 = std::operator<<(poVar5,"oprot_.getTransport().flush(function(error:Dynamic) : Void {"
                              );
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_up((t_generator *)this);
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
      poVar5 = std::operator<<(poVar5,"try {");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_up((t_generator *)this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_570,"appex",(allocator *)(resultname.field_2._M_local_buf + 0xf));
      t_generator::tmp((string *)local_550,(t_generator *)this,&local_570);
      std::__cxx11::string::~string((string *)&local_570);
      std::allocator<char>::~allocator((allocator<char> *)(resultname.field_2._M_local_buf + 0xf));
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
      poVar5 = std::operator<<(poVar5,"var ");
      poVar5 = std::operator<<(poVar5,(string *)local_550);
      poVar5 = std::operator<<(poVar5," : TApplicationException;");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      pptVar7 = __gnu_cxx::
                __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                ::operator*(&local_2d8);
      psVar8 = t_function::get_name_abi_cxx11_(*pptVar7);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&msg.field_2 + 8),psVar8,"_result");
      get_cap_name((string *)local_598,this,(string *)((long)&msg.field_2 + 8));
      std::__cxx11::string::~string((string *)(msg.field_2._M_local_buf + 8));
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
      poVar5 = std::operator<<(poVar5,"if (error != null) {");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_up((t_generator *)this);
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
      poVar5 = std::operator<<(poVar5,"if (onError == null)");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_up((t_generator *)this);
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
      poVar5 = std::operator<<(poVar5,"throw error;");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_down((t_generator *)this);
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
      poVar5 = std::operator<<(poVar5,"onError(error);");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
      poVar5 = std::operator<<(poVar5,"return;");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_down((t_generator *)this);
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
      poVar5 = std::operator<<(poVar5,"}");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_5f8,"msg",(allocator *)(result.field_2._M_local_buf + 0xf));
      t_generator::tmp((string *)local_5d8,(t_generator *)this,&local_5f8);
      std::__cxx11::string::~string((string *)&local_5f8);
      std::allocator<char>::~allocator((allocator<char> *)(result.field_2._M_local_buf + 0xf));
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
      poVar5 = std::operator<<(poVar5,"var ");
      poVar5 = std::operator<<(poVar5,(string *)local_5d8);
      poVar5 = std::operator<<(poVar5," : TMessage = iprot_.readMessageBegin();");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
      poVar5 = std::operator<<(poVar5,"if (");
      poVar5 = std::operator<<(poVar5,(string *)local_5d8);
      poVar5 = std::operator<<(poVar5,".type == TMessageType.EXCEPTION) {");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_up((t_generator *)this);
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
      poVar5 = std::operator<<(poVar5,(string *)local_550);
      poVar5 = std::operator<<(poVar5," = TApplicationException.read(iprot_);");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
      poVar5 = std::operator<<(poVar5,"iprot_.readMessageEnd();");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
      poVar5 = std::operator<<(poVar5,"if (onError == null)");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_up((t_generator *)this);
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
      poVar5 = std::operator<<(poVar5,"throw ");
      poVar5 = std::operator<<(poVar5,(string *)local_550);
      poVar5 = std::operator<<(poVar5,";");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_down((t_generator *)this);
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
      poVar5 = std::operator<<(poVar5,"onError(");
      poVar5 = std::operator<<(poVar5,(string *)local_550);
      poVar5 = std::operator<<(poVar5,");");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
      poVar5 = std::operator<<(poVar5,"return;");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_down((t_generator *)this);
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
      poVar5 = std::operator<<(poVar5,"}");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_640,"result",&local_641);
      t_generator::tmp((string *)local_620,(t_generator *)this,&local_640);
      std::__cxx11::string::~string((string *)&local_640);
      std::allocator<char>::~allocator((allocator<char> *)&local_641);
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
      poVar5 = std::operator<<(poVar5,"var ");
      poVar5 = std::operator<<(poVar5,(string *)local_620);
      poVar5 = std::operator<<(poVar5," : ");
      poVar5 = std::operator<<(poVar5,(string *)local_598);
      poVar5 = std::operator<<(poVar5," = new ");
      poVar5 = std::operator<<(poVar5,(string *)local_598);
      poVar5 = std::operator<<(poVar5,"();");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
      poVar5 = std::operator<<(poVar5,"");
      poVar5 = std::operator<<(poVar5,(string *)local_620);
      poVar5 = std::operator<<(poVar5,".read(iprot_);");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
      poVar5 = std::operator<<(poVar5,"iprot_.readMessageEnd();");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      pptVar7 = __gnu_cxx::
                __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                ::operator*(&local_2d8);
      ptVar10 = t_function::get_returntype(*pptVar7);
      uVar3 = (*(ptVar10->super_t_doc)._vptr_t_doc[4])();
      if ((uVar3 & 1) == 0) {
        poVar5 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
        poVar5 = std::operator<<(poVar5,"if (");
        poVar5 = std::operator<<(poVar5,(string *)local_620);
        poVar5 = std::operator<<(poVar5,".");
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_688,"success",(allocator *)((long)&xs + 7));
        generate_isset_check(&local_668,this,&local_688);
        poVar5 = std::operator<<(poVar5,(string *)&local_668);
        poVar5 = std::operator<<(poVar5,") {");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_668);
        std::__cxx11::string::~string((string *)&local_688);
        std::allocator<char>::~allocator((allocator<char> *)((long)&xs + 7));
        t_generator::indent_up((t_generator *)this);
        poVar5 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
        poVar5 = std::operator<<(poVar5,"if (onSuccess != null)");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        t_generator::indent_up((t_generator *)this);
        poVar5 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
        poVar5 = std::operator<<(poVar5,"onSuccess(");
        poVar5 = std::operator<<(poVar5,(string *)local_620);
        poVar5 = std::operator<<(poVar5,".success);");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        t_generator::indent_down((t_generator *)this);
        poVar5 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
        poVar5 = std::operator<<(poVar5,(string *)local_4a8);
        poVar5 = std::operator<<(poVar5," = ");
        poVar5 = std::operator<<(poVar5,(string *)local_620);
        poVar5 = std::operator<<(poVar5,".success;");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        poVar5 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
        poVar5 = std::operator<<(poVar5,"return;");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        t_generator::indent_down((t_generator *)this);
        poVar5 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
        poVar5 = std::operator<<(poVar5,"}");
        poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      }
      pptVar7 = __gnu_cxx::
                __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                ::operator*(&local_2d8);
      this_00 = t_function::get_xceptions(*pptVar7);
      x_iter._M_current = (t_field **)t_struct::get_members(this_00);
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      __normal_iterator(&local_6a8);
      local_6b0 = (t_field **)
                  std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(x_iter._M_current);
      local_6a8._M_current = local_6b0;
      while( true ) {
        local_6b8._M_current =
             (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(x_iter._M_current);
        bVar1 = __gnu_cxx::operator!=(&local_6a8,&local_6b8);
        if (!bVar1) break;
        poVar5 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
        poVar5 = std::operator<<(poVar5,"if (");
        poVar5 = std::operator<<(poVar5,(string *)local_620);
        poVar5 = std::operator<<(poVar5,".");
        pptVar11 = __gnu_cxx::
                   __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                   ::operator*(&local_6a8);
        psVar8 = t_field::get_name_abi_cxx11_(*pptVar11);
        poVar5 = std::operator<<(poVar5,(string *)psVar8);
        poVar5 = std::operator<<(poVar5," != null) {");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        t_generator::indent_up((t_generator *)this);
        poVar5 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
        poVar5 = std::operator<<(poVar5,"if (onError == null)");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        t_generator::indent_up((t_generator *)this);
        poVar5 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
        poVar5 = std::operator<<(poVar5,"throw ");
        poVar5 = std::operator<<(poVar5,(string *)local_620);
        poVar5 = std::operator<<(poVar5,".");
        pptVar11 = __gnu_cxx::
                   __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                   ::operator*(&local_6a8);
        psVar8 = t_field::get_name_abi_cxx11_(*pptVar11);
        poVar5 = std::operator<<(poVar5,(string *)psVar8);
        poVar5 = std::operator<<(poVar5,";");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        t_generator::indent_down((t_generator *)this);
        poVar5 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
        poVar5 = std::operator<<(poVar5,"onError(");
        poVar5 = std::operator<<(poVar5,(string *)local_620);
        poVar5 = std::operator<<(poVar5,".");
        pptVar11 = __gnu_cxx::
                   __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                   ::operator*(&local_6a8);
        psVar8 = t_field::get_name_abi_cxx11_(*pptVar11);
        poVar5 = std::operator<<(poVar5,(string *)psVar8);
        poVar5 = std::operator<<(poVar5,");");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        poVar5 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
        poVar5 = std::operator<<(poVar5,"return;");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        t_generator::indent_down((t_generator *)this);
        poVar5 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
        poVar5 = std::operator<<(poVar5,"}");
        poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        __gnu_cxx::
        __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
        operator++(&local_6a8);
      }
      pptVar7 = __gnu_cxx::
                __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                ::operator*(&local_2d8);
      ptVar10 = t_function::get_returntype(*pptVar7);
      uVar3 = (*(ptVar10->super_t_doc)._vptr_t_doc[4])();
      if ((uVar3 & 1) == 0) {
        poVar5 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
        poVar5 = std::operator<<(poVar5,(string *)local_550);
        poVar5 = std::operator<<(poVar5," = new TApplicationException(");
        poVar5 = std::operator<<(poVar5,"TApplicationException.MISSING_RESULT,");
        poVar5 = std::operator<<(poVar5,"\"");
        pptVar7 = __gnu_cxx::
                  __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                  ::operator*(&local_2d8);
        psVar8 = t_function::get_name_abi_cxx11_(*pptVar7);
        poVar5 = std::operator<<(poVar5,(string *)psVar8);
        poVar5 = std::operator<<(poVar5," failed: unknown result\");");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        poVar5 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
        poVar5 = std::operator<<(poVar5,"if (onError == null)");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        t_generator::indent_up((t_generator *)this);
        poVar5 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
        poVar5 = std::operator<<(poVar5,"throw ");
        poVar5 = std::operator<<(poVar5,(string *)local_550);
        poVar5 = std::operator<<(poVar5,";");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        t_generator::indent_down((t_generator *)this);
        poVar5 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
        poVar5 = std::operator<<(poVar5,"onError(");
        poVar5 = std::operator<<(poVar5,(string *)local_550);
        poVar5 = std::operator<<(poVar5,");");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        poVar5 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
        poVar5 = std::operator<<(poVar5,"return;");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      }
      else {
        poVar5 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
        poVar5 = std::operator<<(poVar5,"if (onSuccess != null)");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        t_generator::indent_up((t_generator *)this);
        poVar5 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
        poVar5 = std::operator<<(poVar5,"onSuccess();");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        t_generator::indent_down((t_generator *)this);
        poVar5 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
        poVar5 = std::operator<<(poVar5,"return;");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      }
      t_generator::indent_down((t_generator *)this);
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
      poVar5 = std::operator<<(poVar5,"} catch( e : TException) {");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_up((t_generator *)this);
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
      poVar5 = std::operator<<(poVar5,"if (onError == null)");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_up((t_generator *)this);
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
      poVar5 = std::operator<<(poVar5,"throw e;");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_down((t_generator *)this);
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
      poVar5 = std::operator<<(poVar5,"onError(e);");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
      poVar5 = std::operator<<(poVar5,"return;");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_down((t_generator *)this);
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
      poVar5 = std::operator<<(poVar5,"}");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_down((t_generator *)this);
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
      poVar5 = std::operator<<(poVar5,"});");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)local_620);
      std::__cxx11::string::~string((string *)local_5d8);
      std::__cxx11::string::~string((string *)local_598);
      std::__cxx11::string::~string((string *)local_550);
    }
    pptVar7 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_2d8);
    bVar1 = t_function::is_oneway(*pptVar7);
    if (!bVar1) {
      pptVar7 = __gnu_cxx::
                __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                ::operator*(&local_2d8);
      ptVar10 = t_function::get_returntype(*pptVar7);
      uVar3 = (*(ptVar10->super_t_doc)._vptr_t_doc[4])();
      if ((uVar3 & 1) == 0) {
        t_generator::indent_abi_cxx11_(&local_6d8,(t_generator *)this);
        poVar5 = std::operator<<((ostream *)&this->f_service_,(string *)&local_6d8);
        poVar5 = std::operator<<(poVar5,"return ");
        poVar5 = std::operator<<(poVar5,(string *)local_4a8);
        poVar5 = std::operator<<(poVar5,";");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_6d8);
      }
    }
    t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)&this->f_service_);
    std::operator<<((ostream *)&this->f_service_,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)local_4a8);
    std::__cxx11::string::~string(local_3d0);
    std::__cxx11::string::~string((string *)local_388);
    std::__cxx11::string::~string((string *)local_338);
    std::__cxx11::string::~string((string *)&arg_struct);
    __gnu_cxx::
    __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
    ::operator++(&local_2d8);
  }
  t_generator::indent_down((t_generator *)this);
  poVar5 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar5 = std::operator<<(poVar5,"}");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::~vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void t_haxe_generator::generate_service_client(t_service* tservice) {
  string extends = "";
  string extends_client = "";
  if (tservice->get_extends() != nullptr) {
    extends = get_cap_name(tservice->get_extends()->get_name());
    extends_client = " extends " + extends + "Impl";
  }

  generate_rtti_decoration(f_service_);
  // build macro is inherited from interface
  indent(f_service_) << "class " << get_cap_name(service_name_) << "Impl" << extends_client
                     << " implements " << get_cap_name(service_name_) << " {" << endl << endl;
  indent_up();

  indent(f_service_) << "public function new( iprot : TProtocol, oprot : TProtocol = null)" << endl;
  scope_up(f_service_);
  if (extends.empty()) {
    f_service_ << indent() << "iprot_ = iprot;" << endl;
    f_service_ << indent() << "if (oprot == null) {" << endl;
    indent_up();
    f_service_ << indent() << "oprot_ = iprot;" << endl;
    indent_down();
    f_service_ << indent() << "} else {" << endl;
    indent_up();
    f_service_ << indent() << "oprot_ = oprot;" << endl;
    indent_down();
    f_service_ << indent() << "}" << endl;
  } else {
    f_service_ << indent() << "super(iprot, oprot);" << endl;
  }
  scope_down(f_service_);
  f_service_ << endl;

  if (extends.empty()) {
    f_service_ << indent() << "private var iprot_ : TProtocol;" << endl << indent()
               << "private var oprot_ : TProtocol;" << endl << indent()
               << "private var seqid_ : Int;" << endl << endl;

    indent(f_service_) << "public function getInputProtocol() : TProtocol" << endl;
    scope_up(f_service_);
    indent(f_service_) << "return this.iprot_;" << endl;
    scope_down(f_service_);
    f_service_ << endl;

    indent(f_service_) << "public function getOutputProtocol() : TProtocol" << endl;
    scope_up(f_service_);
    indent(f_service_) << "return this.oprot_;" << endl;
    scope_down(f_service_);
    f_service_ << endl;
  }

  // Generate client method implementations
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::const_iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    string funname = (*f_iter)->get_name();

    // Open function
    generate_service_method_signature(*f_iter, false, true);

    indent_up();

    // Get the struct of function call params
    t_struct* arg_struct = (*f_iter)->get_arglist();

    string argsname = get_cap_name((*f_iter)->get_name() + "_args");
    vector<t_field*>::const_iterator fld_iter;
    const vector<t_field*>& fields = arg_struct->get_members();

    // Serialize the request
    string args = tmp("args");
    string calltype = (*f_iter)->is_oneway() ? "ONEWAY" : "CALL";
    f_service_ << indent() << "oprot_.writeMessageBegin(new TMessage(\"" << funname
               << "\", TMessageType." << calltype << ", seqid_));" << endl << indent()
               << "var " << args << " : " << argsname << " = new " << argsname << "();" << endl;

    for (fld_iter = fields.begin(); fld_iter != fields.end(); ++fld_iter) {
      f_service_ << indent() << args << "." << (*fld_iter)->get_name() << " = "
                 << (*fld_iter)->get_name() << ";" << endl;
    }

    f_service_ << indent() << args << ".write(oprot_);" << endl << indent()
               << "oprot_.writeMessageEnd();" << endl;

    string retval = tmp("retval");
    if (!((*f_iter)->is_oneway() || (*f_iter)->get_returntype()->is_void())) {
      f_service_ << indent() << "var " << retval << " : " << type_name((*f_iter)->get_returntype()) << ";"
                 << endl;
    }

    if ((*f_iter)->is_oneway()) {
      f_service_ << indent() << "oprot_.getTransport().flush();" << endl;
    } else {
      indent(f_service_) << "oprot_.getTransport().flush(function(error:Dynamic) : Void {" << endl;
      indent_up();
      indent(f_service_) << "try {" << endl;
      indent_up();
      string appex = tmp("appex");
      indent(f_service_) << "var " << appex << " : TApplicationException;" << endl;
      string resultname = get_cap_name((*f_iter)->get_name() + "_result");
      indent(f_service_) << "if (error != null) {" << endl;
      indent_up();
      indent(f_service_) << "if (onError == null)" << endl;
      indent_up();
      indent(f_service_) << "throw error;" << endl;
      indent_down();
      indent(f_service_) << "onError(error);" << endl;
      indent(f_service_) << "return;" << endl;
      indent_down();
      indent(f_service_) << "}" << endl << endl;
      string msg = tmp("msg");
      indent(f_service_) << "var " << msg << " : TMessage = iprot_.readMessageBegin();" << endl;
      indent(f_service_) << "if (" << msg << ".type == TMessageType.EXCEPTION) {" << endl;
      indent_up();
      indent(f_service_) << appex << " = TApplicationException.read(iprot_);" << endl;
      indent(f_service_) << "iprot_.readMessageEnd();" << endl;
      indent(f_service_) << "if (onError == null)" << endl;
      indent_up();
      indent(f_service_) << "throw " << appex << ";" << endl;
      indent_down();
      indent(f_service_) << "onError(" << appex << ");" << endl;
      indent(f_service_) << "return;" << endl;
      indent_down();
      indent(f_service_) << "}" << endl << endl;
      string result = tmp("result");
      indent(f_service_) << "var " << result << " : " << resultname << " = new " << resultname << "();" << endl;
      indent(f_service_) << "" << result << ".read(iprot_);" << endl;
      indent(f_service_) << "iprot_.readMessageEnd();" << endl;

      // Careful, only return _result if not a void function
      if (!(*f_iter)->get_returntype()->is_void()) {
        indent(f_service_) << "if (" << result << "." << generate_isset_check("success") << ") {" << endl;
        indent_up();
        indent(f_service_) << "if (onSuccess != null)" << endl;
        indent_up();
        indent(f_service_) << "onSuccess(" << result << ".success);" << endl;
        indent_down();
        indent(f_service_) << retval << " = " << result << ".success;" << endl;
        indent(f_service_) << "return;" << endl;
        indent_down();
        indent(f_service_) << "}" << endl << endl;
      }

      t_struct* xs = (*f_iter)->get_xceptions();
      const std::vector<t_field*>& xceptions = xs->get_members();
      vector<t_field*>::const_iterator x_iter;
      for (x_iter = xceptions.begin(); x_iter != xceptions.end(); ++x_iter) {
        indent(f_service_) << "if (" << result << "." << (*x_iter)->get_name() << " != null) {" << endl;
        indent_up();
        indent(f_service_) << "if (onError == null)" << endl;
        indent_up();
        indent(f_service_) << "throw " << result << "." << (*x_iter)->get_name() << ";" << endl;
        indent_down();
        indent(f_service_) << "onError(" << result << "." << (*x_iter)->get_name() << ");" << endl;
        indent(f_service_) << "return;" << endl;
        indent_down();
        indent(f_service_) << "}" << endl << endl;
      }

      // If you get here it's an exception, unless a void function
      if ((*f_iter)->get_returntype()->is_void()) {
        indent(f_service_) << "if (onSuccess != null)" << endl;
        indent_up();
        indent(f_service_) << "onSuccess();" << endl;
        indent_down();
        indent(f_service_) << "return;" << endl;
      } else {
        indent(f_service_) << appex << " = new TApplicationException("
                           << "TApplicationException.MISSING_RESULT,"
                           << "\"" << (*f_iter)->get_name() << " failed: unknown result\");" << endl;
        indent(f_service_) << "if (onError == null)" << endl;
        indent_up();
        indent(f_service_) << "throw " << appex << ";" << endl;
        indent_down();
        indent(f_service_) << "onError(" << appex << ");" << endl;
        indent(f_service_) << "return;" << endl;
      }

      indent_down();
      indent(f_service_) << endl;
      indent(f_service_) << "} catch( e : TException) {" << endl;
      indent_up();
      indent(f_service_) << "if (onError == null)" << endl;
      indent_up();
      indent(f_service_) << "throw e;" << endl;
      indent_down();
      indent(f_service_) << "onError(e);" << endl;
      indent(f_service_) << "return;" << endl;
      indent_down();
      indent(f_service_) << "}" << endl;

      indent_down();
      indent(f_service_) << "});" << endl << endl;
    }

    if (!((*f_iter)->is_oneway() || (*f_iter)->get_returntype()->is_void())) {
      f_service_ << indent() << "return " << retval << ";" << endl;
    }

    // Close function
    scope_down(f_service_);
    f_service_ << endl;
  }

  indent_down();
  indent(f_service_) << "}" << endl;
}